

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O3

void __thiscall
prometheus::Histogram::ObserveMultiple
          (Histogram *this,vector<double,_std::allocator<double>_> *bucket_increments,
          double sum_of_values)

{
  mutex *__mutex;
  int iVar1;
  pointer pCVar2;
  length_error *this_00;
  undefined8 uVar3;
  ulong uVar4;
  
  if ((long)(bucket_increments->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(bucket_increments->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start !=
      (long)(this->bucket_counts_).
            super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->bucket_counts_).
            super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
            super__Vector_impl_data._M_start) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error
              (this_00,
               "The size of bucket_increments was not equal tothe number of buckets in the histogram."
              );
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  __mutex = &this->mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    Gauge::Increment(&this->sum_,sum_of_values);
    pCVar2 = (this->bucket_counts_).
             super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->bucket_counts_).
        super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar2) {
      uVar4 = 0;
      do {
        Counter::Increment(pCVar2 + uVar4,
                           (bucket_increments->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar4]);
        uVar4 = uVar4 + 1;
        pCVar2 = (this->bucket_counts_).
                 super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(this->bucket_counts_).
                                     super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 3)
              );
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  __cxa_free_exception(__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void Histogram::ObserveMultiple(const std::vector<double>& bucket_increments,
                                const double sum_of_values) {
  if (bucket_increments.size() != bucket_counts_.size()) {
    throw std::length_error(
        "The size of bucket_increments was not equal to"
        "the number of buckets in the histogram.");
  }

  std::lock_guard<std::mutex> lock(mutex_);
  sum_.Increment(sum_of_values);

  for (std::size_t i{0}; i < bucket_counts_.size(); ++i) {
    bucket_counts_[i].Increment(bucket_increments[i]);
  }
}